

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgtool.cpp
# Opt level: O2

int error(int argc,char **argv)

{
  uint *puVar1;
  pointer pVVar2;
  long lVar3;
  undefined1 auVar4 [16];
  long lVar5;
  pointer pbVar6;
  pointer pAVar7;
  Point2i PVar8;
  bool bVar9;
  bool bVar10;
  int iVar11;
  Allocator AVar12;
  allocator_type aVar13;
  iterator pvVar14;
  vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>
  *pvVar15;
  Tuple2<pbrt::Point2,_int> TVar16;
  uint uVar17;
  value_type *mcve_1;
  Array2D<std::vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>_>
  *this;
  Array2D<std::vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>_>
  *__range2;
  pointer this_00;
  ulong uVar18;
  pointer pbVar19;
  function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
  *in_R9;
  int x_1;
  int c;
  long lVar20;
  long lVar21;
  int x;
  value_type *mcve;
  long lVar22;
  float fVar23;
  undefined4 in_XMM2_Da;
  undefined4 in_XMM2_Db;
  undefined8 in_XMM2_Qb;
  span<int> out;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  channels;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  filenames;
  char **argv_local;
  array<int,_4UL> cropWindow;
  Array2D<std::vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>_>
  pixelVariance;
  vector<pbrt::Array2D<std::vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>_>,_std::allocator<pbrt::Array2D<std::vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>_>_>_>
  pixelVariances;
  string metric;
  vector<double,_std::allocator<double>_> sumErrors;
  string filenameBase;
  _Any_data local_588;
  code *local_578;
  code *local_570;
  vector<int,_std::allocator<int>_> spp;
  _Any_data local_548;
  code *local_538;
  code *local_530;
  _Any_data local_528;
  code *local_518;
  code *local_510;
  string errorFile;
  string referenceFile;
  _Any_data local_4c8;
  code *pcStack_4b8;
  code *pcStack_4b0;
  _Any_data local_4a8;
  code *local_498;
  code *local_490;
  ColorEncodingHandle local_480;
  anon_class_8_1_e625a05e crop;
  ColorEncodingHandle local_470;
  undefined1 local_468 [72];
  undefined8 uStack_420;
  undefined8 uStack_418;
  undefined8 uStack_410;
  undefined8 uStack_408;
  undefined8 uStack_400;
  undefined8 uStack_3f8;
  undefined8 uStack_3f0;
  undefined8 uStack_3e8;
  undefined8 uStack_3e0;
  aligned_storage_t<sizeof(pbrt::Bounds2<int>),_alignof(pbrt::Bounds2<int>)> aStack_3d8;
  undefined8 uStack_3c8;
  undefined8 local_3c0;
  optional<int> oStack_3b8;
  optional<float> oStack_3b0;
  aligned_storage_t<sizeof(const_pbrt::RGBColorSpace_*),_alignof(const_pbrt::RGBColorSpace_*)>
  aStack_3a8;
  undefined8 uStack_3a0;
  _Rb_tree_impl<std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
  _Stack_398;
  Image errorImage;
  ImageAndMetadata ref;
  
  referenceFile._M_dataplus._M_p = (pointer)&referenceFile.field_2;
  errorFile._M_dataplus._M_p = (pointer)&errorFile.field_2;
  referenceFile._M_string_length = 0;
  errorFile._M_string_length = 0;
  referenceFile.field_2._M_local_buf[0] = '\0';
  errorFile.field_2._M_local_buf[0] = '\0';
  argv_local = argv;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&metric,"MSE",(allocator<char> *)&ref);
  filenameBase._M_dataplus._M_p = (pointer)&filenameBase.field_2;
  filenameBase._M_string_length = 0;
  filenameBase.field_2._M_local_buf[0] = '\0';
  cropWindow._M_elems[0] = -1;
  cropWindow._M_elems[1] = 0;
  cropWindow._M_elems[2] = -1;
  cropWindow._M_elems[3] = 0;
LAB_0025cbdf:
  if (*argv != (char *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&ref,"reference",(allocator<char> *)&filenames);
    local_528._M_unused._M_object = (void *)0x0;
    local_528._8_8_ = 0;
    local_510 = std::
                _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/imgtool.cpp:661:24)>
                ::_M_invoke;
    local_518 = std::
                _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/imgtool.cpp:661:24)>
                ::_M_manager;
    bVar9 = pbrt::ParseArg<std::__cxx11::string*>
                      (&argv_local,(string *)&ref,&referenceFile,
                       (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                        *)&local_528);
    if (!bVar9) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&errorImage,"errorfile",(allocator<char> *)&pixelVariances);
      local_588._M_unused._M_object = (void *)0x0;
      local_588._8_8_ = 0;
      local_570 = std::
                  _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/imgtool.cpp:661:24)>
                  ::_M_invoke;
      local_578 = std::
                  _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/imgtool.cpp:661:24)>
                  ::_M_manager;
      bVar9 = pbrt::ParseArg<std::__cxx11::string*>
                        (&argv_local,(string *)&errorImage,&errorFile,
                         (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                          *)&local_588);
      if (!bVar9) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_468,"metric",(allocator<char> *)&sumErrors);
        local_548._M_unused._M_object = (void *)0x0;
        local_548._8_8_ = 0;
        local_530 = std::
                    _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/imgtool.cpp:661:24)>
                    ::_M_invoke;
        local_538 = std::
                    _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/imgtool.cpp:661:24)>
                    ::_M_manager;
        bVar9 = pbrt::ParseArg<std::__cxx11::string*>
                          (&argv_local,(string *)local_468,&metric,
                           (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                            *)&local_548);
        bVar10 = true;
        if (!bVar9) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&pixelVariance,"crop",(allocator<char> *)&spp);
          local_4a8._M_unused._M_object = (void *)0x0;
          local_4a8._8_8_ = 0;
          local_490 = std::
                      _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/imgtool.cpp:661:24)>
                      ::_M_invoke;
          local_498 = std::
                      _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/imgtool.cpp:661:24)>
                      ::_M_manager;
          out.n = (size_t)&local_4a8;
          out.ptr = (int *)0x4;
          bVar10 = pbrt::ParseArg<pstd::span<int>>
                             ((pbrt *)&argv_local,(char ***)&pixelVariance,(string *)&cropWindow,out
                              ,in_R9);
          std::_Function_base::~_Function_base((_Function_base *)&local_4a8);
          std::__cxx11::string::~string((string *)&pixelVariance);
        }
        std::_Function_base::~_Function_base((_Function_base *)&local_548);
        std::__cxx11::string::~string((string *)local_468);
        std::_Function_base::~_Function_base((_Function_base *)&local_588);
        std::__cxx11::string::~string((string *)&errorImage);
        std::_Function_base::~_Function_base((_Function_base *)&local_528);
        std::__cxx11::string::~string((string *)&ref);
        argv = argv_local;
        if (bVar10 == false) {
          if ((filenameBase._M_string_length != 0) || (**argv_local == '-')) {
            usage("error","%s: unknown argument");
          }
          std::__cxx11::string::assign((char *)&filenameBase);
          argv = argv_local + 1;
          argv_local = argv;
        }
        goto LAB_0025cbdf;
      }
      std::_Function_base::~_Function_base((_Function_base *)&local_588);
      std::__cxx11::string::~string((string *)&errorImage);
    }
    std::_Function_base::~_Function_base((_Function_base *)&local_528);
    std::__cxx11::string::~string((string *)&ref);
    argv = argv_local;
    goto LAB_0025cbdf;
  }
  if (filenameBase._M_string_length == 0) {
    usage("error","Must provide base filename.");
  }
  bVar9 = std::operator!=(&metric,"MSE");
  if (((bVar9) && (bVar9 = std::operator!=(&metric,"MRSE"), bVar9)) &&
     (bVar9 = std::operator!=(&metric,"L1"), bVar9)) {
    usage("error","%s: --metric must be \"L1\", \"MSE\" or \"MRSE\".",metric._M_dataplus._M_p);
  }
  pbrt::MatchingFilenames(&filenames,&filenameBase);
  if (filenames.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      filenames.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    fprintf(_stderr,"%s: no matching filenames!\n",filenameBase._M_dataplus._M_p);
    uVar17 = 1;
    goto LAB_0025d492;
  }
  if (referenceFile._M_string_length == 0) {
    usage("error","must provide --reference file.");
  }
  AVar12.memoryResource = pstd::pmr::new_delete_resource();
  local_470.
  super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>.
  bits = (TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
          )0;
  pbrt::Image::Read(&ref,&referenceFile,AVar12,&local_470);
  if ((long)cropWindow._M_elems._0_8_ < 0) {
    cropWindow._M_elems[1] = cropWindow._M_elems[0] - cropWindow._M_elems[1];
  }
  if ((long)cropWindow._M_elems._8_8_ < 0) {
    cropWindow._M_elems[3] = cropWindow._M_elems[2] - cropWindow._M_elems[3];
  }
  crop.cropWindow = &cropWindow;
  error::anon_class_8_1_e625a05e::operator()(&crop,&ref.image);
  iVar11 = pbrt::MaxThreadIndex();
  std::
  vector<pbrt::Array2D<std::vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>_>,_std::allocator<pbrt::Array2D<std::vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>_>_>_>
  ::vector(&pixelVariances,(long)iVar11,(allocator_type *)&errorImage);
  pAVar7 = pixelVariances.
           super__Vector_base<pbrt::Array2D<std::vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>_>,_std::allocator<pbrt::Array2D<std::vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (this_00 = pixelVariances.
                 super__Vector_base<pbrt::Array2D<std::vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>_>,_std::allocator<pbrt::Array2D<std::vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      PVar8.super_Tuple2<pbrt::Point2,_int> = ref.image.resolution.super_Tuple2<pbrt::Point2,_int>,
      this_00 != pAVar7; this_00 = this_00 + 1) {
    aVar13.memoryResource = pstd::pmr::new_delete_resource();
    pbrt::
    Array2D<std::vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>_>
    ::Array2D((Array2D<std::vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>_>
               *)&errorImage,PVar8.super_Tuple2<pbrt::Point2,_int>.x,
              PVar8.super_Tuple2<pbrt::Point2,_int>.y,aVar13);
    pbrt::
    Array2D<std::vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>_>
    ::operator=(this_00,(Array2D<std::vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>_>
                         *)&errorImage);
    pbrt::
    Array2D<std::vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>_>
    ::~Array2D((Array2D<std::vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>_>
                *)&errorImage);
    pvVar15 = this_00->values;
    pvVar14 = pbrt::
              Array2D<std::vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>_>
              ::end(this_00);
    for (; pvVar15 != pvVar14; pvVar15 = pvVar15 + 1) {
      std::
      vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>::
      resize(pvVar15,(long)(int)ref.image.channelNames.nStored);
    }
  }
  iVar11 = pbrt::MaxThreadIndex();
  errorImage.format = U256;
  errorImage.resolution.super_Tuple2<pbrt::Point2,_int>.x = 0;
  std::vector<double,_std::allocator<double>_>::vector
            (&sumErrors,(long)iVar11,(value_type_conflict4 *)&errorImage,(allocator_type *)local_468
            );
  std::vector<int,_std::allocator<int>_>::vector
            (&spp,(long)filenames.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)filenames.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 5,(allocator_type *)&errorImage
            );
  pbVar6 = filenames.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pbVar19 = filenames.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_4c8._M_unused._M_object = (void *)0x0;
  local_4c8._8_8_ = 0;
  pcStack_4b8 = (code *)0x0;
  pcStack_4b0 = (code *)0x0;
  local_4c8._M_unused._M_object = operator_new(0x38);
  *(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    **)local_4c8._M_unused._0_8_ = &filenames;
  *(anon_class_8_1_e625a05e **)((long)local_4c8._M_unused._0_8_ + 8) = &crop;
  *(vector<int,_std::allocator<int>_> **)((long)local_4c8._M_unused._0_8_ + 0x10) = &spp;
  *(ImageAndMetadata **)((long)local_4c8._M_unused._0_8_ + 0x18) = &ref;
  *(string **)((long)local_4c8._M_unused._0_8_ + 0x20) = &metric;
  *(vector<double,_std::allocator<double>_> **)((long)local_4c8._M_unused._0_8_ + 0x28) = &sumErrors
  ;
  *(vector<pbrt::Array2D<std::vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>_>,_std::allocator<pbrt::Array2D<std::vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>_>_>_>
    **)((long)local_4c8._M_unused._0_8_ + 0x30) = &pixelVariances;
  pcStack_4b0 = std::
                _Function_handler<void_(long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/imgtool.cpp:721:38)>
                ::_M_invoke;
  pcStack_4b8 = std::
                _Function_handler<void_(long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/imgtool.cpp:721:38)>
                ::_M_manager;
  pbrt::ParallelFor(0,(long)pbVar6 - (long)pbVar19 >> 5,(function<void_(long)> *)&local_4c8);
  std::_Function_base::~_Function_base((_Function_base *)&local_4c8);
  PVar8 = ref.image.resolution;
  uVar18 = 1;
  pbVar19 = filenames.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  do {
    if ((ulong)((long)filenames.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)filenames.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 5) <= uVar18) goto LAB_0025d102;
    puVar1 = (uint *)(spp.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start + uVar18);
    uVar18 = uVar18 + 1;
    pbVar19 = pbVar19 + 1;
  } while (*puVar1 ==
           *spp.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start);
  printf("%s: spp %d mismatch. %s has %d.\n",(pbVar19->_M_dataplus)._M_p,(ulong)*puVar1,
         ((filenames.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p);
  uVar17 = 1;
LAB_0025d461:
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&spp.super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&sumErrors.super__Vector_base<double,_std::allocator<double>_>);
  std::
  vector<pbrt::Array2D<std::vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>_>,_std::allocator<pbrt::Array2D<std::vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>_>_>_>
  ::~vector(&pixelVariances);
  pbrt::ImageAndMetadata::~ImageAndMetadata(&ref);
LAB_0025d492:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&filenames);
  std::__cxx11::string::~string((string *)&filenameBase);
  std::__cxx11::string::~string((string *)&metric);
  std::__cxx11::string::~string((string *)&errorFile);
  std::__cxx11::string::~string((string *)&referenceFile);
  return uVar17;
LAB_0025d102:
  for (; sumErrors.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_start !=
         sumErrors.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_finish;
      sumErrors.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = sumErrors.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start + 1) {
  }
  aVar13.memoryResource = pstd::pmr::new_delete_resource();
  pbrt::
  Array2D<std::vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>_>
  ::Array2D(&pixelVariance,PVar8.super_Tuple2<pbrt::Point2,_int>.x,
            PVar8.super_Tuple2<pbrt::Point2,_int>.y,aVar13);
  for (lVar20 = (long)((pixelVariance.extent.pMax.super_Tuple2<pbrt::Point2,_int>.y -
                       pixelVariance.extent.pMin.super_Tuple2<pbrt::Point2,_int>.y) *
                      (pixelVariance.extent.pMax.super_Tuple2<pbrt::Point2,_int>.x -
                      pixelVariance.extent.pMin.super_Tuple2<pbrt::Point2,_int>.x)) * 0x18;
      this = pixelVariances.
             super__Vector_base<pbrt::Array2D<std::vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>_>,_std::allocator<pbrt::Array2D<std::vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start, lVar20 != 0; lVar20 = lVar20 + -0x18) {
    std::vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>
    ::resize(pixelVariance.values,(long)(int)ref.image.channelNames.nStored);
    pixelVariance.values = pixelVariance.values + 1;
  }
  for (; PVar8.super_Tuple2<pbrt::Point2,_int> =
              ref.image.resolution.super_Tuple2<pbrt::Point2,_int>,
      this != pixelVariances.
              super__Vector_base<pbrt::Array2D<std::vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>_>,_std::allocator<pbrt::Array2D<std::vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish; this = this + 1) {
    TVar16 = ref.image.resolution.super_Tuple2<pbrt::Point2,_int>;
    for (iVar11 = 0; iVar11 < TVar16.y; iVar11 = iVar11 + 1) {
      for (x = 0; x < TVar16.x; x = x + 1) {
        lVar20 = 0;
        for (lVar21 = 0; lVar21 < (int)ref.image.channelNames.nStored; lVar21 = lVar21 + 1) {
          pvVar15 = pbrt::
                    Array2D<std::vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>_>
                    ::operator()(&pixelVariance,x,iVar11);
          pVVar2 = (pvVar15->
                   super__Vector_base<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          pvVar15 = pbrt::
                    Array2D<std::vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>_>
                    ::operator()(this,x,iVar11);
          pbrt::VarianceEstimator<double>::Merge
                    ((VarianceEstimator<double> *)((long)&pVVar2->mean + lVar20),
                     (VarianceEstimator<double> *)
                     ((long)&((pvVar15->
                              super__Vector_base<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>
                              )._M_impl.super__Vector_impl_data._M_start)->mean + lVar20));
          lVar20 = lVar20 + 0x18;
        }
        TVar16 = ref.image.resolution.super_Tuple2<pbrt::Point2,_int>;
      }
    }
  }
  std::__cxx11::string::string((string *)local_468,(string *)&metric);
  local_480.
  super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>.
  bits = (TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
          )0;
  AVar12.memoryResource = pstd::pmr::new_delete_resource();
  channels.n = 1;
  channels.ptr = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_468;
  pbrt::Image::Image(&errorImage,Float,PVar8,channels,&local_480,AVar12);
  std::__cxx11::string::~string((string *)local_468);
  TVar16 = ref.image.resolution.super_Tuple2<pbrt::Point2,_int>;
  for (lVar20 = 0; lVar20 < (long)TVar16 >> 0x20; lVar20 = lVar20 + 1) {
    for (uVar18 = 0; (long)uVar18 < (long)TVar16.x; uVar18 = uVar18 + 1) {
      fVar23 = 0.0;
      lVar21 = 0x10;
      for (lVar22 = 0; lVar22 < (int)ref.image.channelNames.nStored; lVar22 = lVar22 + 1) {
        pvVar15 = pbrt::
                  Array2D<std::vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>_>
                  ::operator()(&pixelVariance,(int)uVar18,(int)lVar20);
        pVVar2 = (pvVar15->
                 super__Vector_base<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        lVar5 = lVar21 + -8;
        lVar3 = *(long *)((long)&pVVar2->mean + lVar21);
        lVar21 = lVar21 + 0x18;
        fVar23 = (float)((double)((ulong)(1 < lVar3) *
                                 (long)(*(double *)((long)pVVar2 + lVar5) / (double)(lVar3 + -1))) +
                        (double)fVar23);
      }
      pbrt::Image::SetChannel
                (&errorImage,(Point2i)(lVar20 << 0x20 | uVar18),0,
                 fVar23 / (float)(int)ref.image.channelNames.nStored);
      TVar16 = ref.image.resolution.super_Tuple2<pbrt::Point2,_int>;
    }
  }
  auVar4._4_4_ = in_XMM2_Db;
  auVar4._0_4_ = in_XMM2_Da;
  auVar4._8_8_ = in_XMM2_Qb;
  vcvtusi2sd_avx512f(auVar4,((long)filenames.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)filenames.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 5) + -1);
  printf("%s estimate = %.9g\n",metric._M_dataplus._M_p);
  if (errorFile._M_string_length == 0) {
    uVar17 = 0;
  }
  else {
    _Stack_398.super__Rb_tree_header._M_header._M_left = &_Stack_398.super__Rb_tree_header._M_header
    ;
    aStack_3a8 = (aligned_storage_t<sizeof(const_pbrt::RGBColorSpace_*),_alignof(const_pbrt::RGBColorSpace_*)>
                  )0x0;
    uStack_3a0._0_1_ = false;
    uStack_3a0._1_7_ = 0;
    _Stack_398._0_8_ = 0;
    _Stack_398.super__Rb_tree_header._M_header._M_color = _S_red;
    _Stack_398.super__Rb_tree_header._M_header._4_4_ = 0;
    _Stack_398.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    uStack_3e8 = 0;
    uStack_3e0 = 0;
    aStack_3d8._0_8_ = 0;
    aStack_3d8._8_8_ = 0;
    uStack_3c8 = 0;
    local_3c0 = 0;
    oStack_3b8.optionalValue = (aligned_storage_t<sizeof(int),_alignof(int)>)0x0;
    oStack_3b8.set = false;
    oStack_3b8._5_3_ = 0;
    oStack_3b0.optionalValue = (aligned_storage_t<sizeof(float),_alignof(float)>)0x0;
    oStack_3b0.set = false;
    oStack_3b0._5_3_ = 0;
    local_468._64_8_ = 0;
    uStack_420 = 0;
    uStack_418 = 0;
    uStack_410 = 0;
    uStack_408 = 0;
    uStack_400 = 0;
    uStack_3f8 = 0;
    uStack_3f0 = 0;
    local_468._0_4_ = (aligned_storage_t<sizeof(float),_alignof(float)>)0x0;
    local_468[4] = false;
    local_468._5_3_ = 0;
    local_468._8_8_ = 0;
    local_468._16_8_ = 0;
    local_468._24_8_ = 0;
    local_468._32_8_ = 0;
    local_468._40_8_ = 0;
    local_468._48_8_ = 0;
    local_468._56_8_ = 0;
    _Stack_398.super__Rb_tree_header._M_node_count = 0;
    _Stack_398.super__Rb_tree_header._M_header._M_right =
         _Stack_398.super__Rb_tree_header._M_header._M_left;
    bVar9 = pbrt::Image::Write(&errorImage,&errorFile,(ImageMetadata *)local_468);
    pbrt::ImageMetadata::~ImageMetadata((ImageMetadata *)local_468);
    uVar17 = (uint)!bVar9;
  }
  pbrt::Image::~Image(&errorImage);
  pbrt::
  Array2D<std::vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>_>
  ::~Array2D(&pixelVariance);
  goto LAB_0025d461;
}

Assistant:

int error(int argc, char *argv[]) {
    std::string referenceFile, errorFile, metric = "MSE";
    std::string filenameBase;
    std::array<int, 4> cropWindow = {-1, 0, -1, 0};

    while (*argv != nullptr) {
        auto onError = [](const std::string &err) {
            usage("error", "%s", err.c_str());
            exit(1);
        };

        if (ParseArg(&argv, "reference", &referenceFile, onError) ||
            ParseArg(&argv, "errorfile", &errorFile, onError) ||
            ParseArg(&argv, "metric", &metric, onError) ||
            ParseArg(&argv, "crop", pstd::MakeSpan(cropWindow), onError)) {
            // success
        } else if (filenameBase.empty() && argv[0][0] != '-') {
            filenameBase = *argv;
            ++argv;
        } else
            usage("error", "%s: unknown argument", *argv);
    }

    if (filenameBase.empty())
        usage("error", "Must provide base filename.");
    if (metric != "MSE" && metric != "MRSE" && metric != "L1")
        usage("error", "%s: --metric must be \"L1\", \"MSE\" or \"MRSE\".",
              metric.c_str());

    std::vector<std::string> filenames = MatchingFilenames(filenameBase);
    if (filenames.empty()) {
        fprintf(stderr, "%s: no matching filenames!\n", filenameBase.c_str());
        return 1;
    }

    if (referenceFile.empty())
        usage("error", "must provide --reference file.");
    ImageAndMetadata ref = Image::Read(referenceFile);
    Image &referenceImage = ref.image;

    // If last 2 are negative, they're taken as deltas
    if (cropWindow[1] < 0)
        cropWindow[1] = cropWindow[0] - cropWindow[1];
    if (cropWindow[3] < 0)
        cropWindow[3] = cropWindow[2] - cropWindow[3];
    auto crop = [&cropWindow](Image &image) {
        if (cropWindow[0] >= 0 && cropWindow[2] >= 0)
            image = image.Crop(
                Bounds2i({cropWindow[0], cropWindow[2]}, {cropWindow[1], cropWindow[3]}));
    };

    crop(referenceImage);

    // Compute error and error image
    using MultiChannelVarianceEstimator = std::vector<VarianceEstimator<double>>;
    std::vector<Array2D<MultiChannelVarianceEstimator>> pixelVariances(MaxThreadIndex());
    for (auto &amcve : pixelVariances) {
        amcve = Array2D<MultiChannelVarianceEstimator>(referenceImage.Resolution().x,
                                                       referenceImage.Resolution().y);
        for (auto &mcve : amcve)
            mcve.resize(referenceImage.NChannels());
    }

    std::vector<double> sumErrors(MaxThreadIndex(), 0.);
    std::vector<int> spp(filenames.size());
    std::atomic<bool> failed{false};
    ParallelFor(0, filenames.size(), [&](size_t i) {
        ImageAndMetadata imRead = Image::Read(filenames[i]);
        Image &im = imRead.image;
        crop(im);

        CHECK(imRead.metadata.samplesPerPixel.has_value());
        spp[i] = *imRead.metadata.samplesPerPixel;

        Image diffImage;
        ImageChannelValues error(referenceImage.NChannels());
        if (metric == "L1")
            error = im.L1Error(im.AllChannelsDesc(), referenceImage, &diffImage);
        else if (metric == "MSE")
            error = im.MSE(im.AllChannelsDesc(), referenceImage, &diffImage);
        else
            error = im.MRSE(im.AllChannelsDesc(), referenceImage, &diffImage);
        sumErrors[ThreadIndex] += error.Average();

        for (int y = 0; y < im.Resolution().y; ++y)
            for (int x = 0; x < im.Resolution().x; ++x) {
                MultiChannelVarianceEstimator &pixelVariance =
                    pixelVariances[ThreadIndex](x, y);
                for (int c = 0; c < im.NChannels(); ++c)
                    if (metric == "MRSE")
                        pixelVariance[c].Add(
                            im.GetChannel({x, y}, c) /
                            (0.01f + referenceImage.GetChannel({x, y}, c)));
                    else
                        pixelVariance[c].Add(im.GetChannel({x, y}, c));
            }
    });

    for (int i = 1; i < filenames.size(); ++i) {
        if (spp[i] != spp[0]) {
            printf("%s: spp %d mismatch. %s has %d.\n", filenames[i].c_str(), spp[i],
                   filenames[0].c_str(), spp[0]);
            return 1;
        }
    }

    if (failed)
        return 1;

    double sumError = std::accumulate(sumErrors.begin(), sumErrors.end(), 0.);

    Array2D<MultiChannelVarianceEstimator> pixelVariance(referenceImage.Resolution().x,
                                                         referenceImage.Resolution().y);
    for (auto &mcve : pixelVariance)
        mcve.resize(referenceImage.NChannels());

    for (const auto &pixVar : pixelVariances)
        for (int y = 0; y < referenceImage.Resolution().y; ++y)
            for (int x = 0; x < referenceImage.Resolution().x; ++x)
                for (int c = 0; c < referenceImage.NChannels(); ++c)
                    pixelVariance(x, y)[c].Merge(pixVar(x, y)[c]);

    Image errorImage(PixelFormat::Float,
                     {referenceImage.Resolution().x, referenceImage.Resolution().y},
                     {metric});
    for (int y = 0; y < referenceImage.Resolution().y; ++y)
        for (int x = 0; x < referenceImage.Resolution().x; ++x) {
            Float varSum = 0;
            for (int c = 0; c < referenceImage.NChannels(); ++c)
                varSum += pixelVariance(x, y)[c].Variance();
            errorImage.SetChannel({x, y}, 0, varSum / referenceImage.NChannels());
        }

    // MSE is the average over all of the pixels
    double error = sumError / (filenames.size() - 1);
    printf("%s estimate = %.9g\n", metric.c_str(), error);

    if (!errorFile.empty() && !errorImage.Write(errorFile)) {
        return 1;
    }

    return 0;
}